

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# x11authfile.c
# Opt level: O2

void x11_get_auth_from_authfile(X11Display *disp,char *authfilename)

{
  _Bool _Var1;
  _Bool _Var2;
  FILE *__stream;
  char *str;
  void *__ptr;
  size_t sVar3;
  char *__nptr;
  uchar *__dest;
  byte bVar4;
  byte bVar5;
  int iVar6;
  uint uVar7;
  long lVar8;
  undefined1 auVar9 [16];
  ptrlen pl;
  ptrlen pVar10;
  ptrlen pVar11;
  char (*local_a0) [4];
  size_t local_98;
  BinarySource src [1];
  char buf [4];
  char cStack_44;
  char cStack_43;
  char cStack_42;
  char cStack_41;
  char cStack_40;
  char cStack_3f;
  char cStack_3e;
  char cStack_3d;
  char cStack_3c;
  char cStack_3b;
  char cStack_3a;
  char cStack_39;
  
  if (disp->unixdomain == false) {
    _Var1 = sk_address_is_local(disp->addr);
  }
  else {
    _Var1 = false;
  }
  __stream = fopen(authfilename,"rb");
  if (__stream != (FILE *)0x0) {
    str = get_hostname();
    __ptr = safemalloc(0x8000c,1,0);
    sVar3 = fread(__ptr,1,0x8000c,__stream);
    src[0].len = (size_t)(int)sVar3;
    src[0].binarysource_ = src;
    src[0].pos = 0;
    src[0].err = BSE_NO_ERROR;
    src[0].data = __ptr;
    bVar5 = 0;
LAB_0015cce9:
    if (bVar5 == 0) {
      if (0x40005 < src[0].pos) {
        iVar6 = (int)sVar3 - (int)src[0].pos;
        sVar3 = (size_t)iVar6;
        memcpy(__ptr,(void *)(src[0].pos + (long)__ptr),sVar3);
        sVar3 = fread((void *)((long)__ptr + sVar3),1,0x8000c - sVar3,__stream);
        uVar7 = iVar6 + (int)sVar3;
        sVar3 = (size_t)uVar7;
        src[0].len = (size_t)(int)uVar7;
        src[0].pos = 0;
        src[0].err = BSE_NO_ERROR;
        src[0].binarysource_ = src;
        src[0].data = __ptr;
      }
      uVar7 = BinarySource_get_uint16(src[0].binarysource_);
      pl = BinarySource_get_string_xauth(src[0].binarysource_);
      pVar10 = BinarySource_get_string_xauth(src[0].binarysource_);
      __nptr = mkstr(pVar10);
      iVar6 = -1;
      if (*__nptr != '\0') {
        iVar6 = atoi(__nptr);
      }
      safefree(__nptr);
      pVar10 = BinarySource_get_string_xauth(src[0].binarysource_);
      pVar11 = BinarySource_get_string_xauth(src[0].binarysource_);
      if ((src[0].binarysource_)->err != BSE_NO_ERROR) goto LAB_0015cfb6;
      bVar5 = 0;
      if ((-1 < disp->displaynum) && (bVar5 = 0, iVar6 < 0 || disp->displaynum == iVar6)) {
        lVar8 = 1;
        while( true ) {
          local_98 = pl.len;
          local_a0 = (char (*) [4])pl.ptr;
          if (lVar8 == 3) break;
          _Var2 = ptrlen_eq_string(pVar10,x11_authnames[lVar8]);
          if (_Var2) {
            if (uVar7 == 0x100) {
              if (disp->unixdomain == false) {
                bVar5 = 0;
                if ((str != (char *)0x0 & _Var1) == 0) goto LAB_0015cce9;
              }
              else {
                bVar5 = 0;
                if (str == (char *)0x0) goto LAB_0015cce9;
              }
              _Var2 = ptrlen_eq_string(pl,str);
              bVar5 = 0;
              bVar4 = 1;
              if (!_Var2) goto LAB_0015cce9;
            }
            else {
              bVar5 = 0;
              bVar4 = _Var1 ^ 1;
              if (uVar7 == 6) {
                if (disp->unixdomain != false) goto LAB_0015cce9;
                iVar6 = sk_addrtype(disp->addr);
                bVar5 = 0;
                if (iVar6 != 2) goto LAB_0015cce9;
                sk_addrcopy(disp->addr,buf);
                if (local_98 != 0x10) break;
                auVar9[0] = -((*local_a0)[0] == buf[0]);
                auVar9[1] = -((*local_a0)[1] == buf[1]);
                auVar9[2] = -((*local_a0)[2] == buf[2]);
                auVar9[3] = -((*local_a0)[3] == buf[3]);
                auVar9[4] = -(local_a0[1][0] == cStack_44);
                auVar9[5] = -(local_a0[1][1] == cStack_43);
                auVar9[6] = -(local_a0[1][2] == cStack_42);
                auVar9[7] = -(local_a0[1][3] == cStack_41);
                auVar9[8] = -(local_a0[2][0] == cStack_40);
                auVar9[9] = -(local_a0[2][1] == cStack_3f);
                auVar9[10] = -(local_a0[2][2] == cStack_3e);
                auVar9[0xb] = -(local_a0[2][3] == cStack_3d);
                auVar9[0xc] = -(local_a0[3][0] == cStack_3c);
                auVar9[0xd] = -(local_a0[3][1] == cStack_3b);
                auVar9[0xe] = -(local_a0[3][2] == cStack_3a);
                auVar9[0xf] = -(local_a0[3][3] == cStack_39);
                if ((ushort)((ushort)(SUB161(auVar9 >> 7,0) & 1) |
                             (ushort)(SUB161(auVar9 >> 0xf,0) & 1) << 1 |
                             (ushort)(SUB161(auVar9 >> 0x17,0) & 1) << 2 |
                             (ushort)(SUB161(auVar9 >> 0x1f,0) & 1) << 3 |
                             (ushort)(SUB161(auVar9 >> 0x27,0) & 1) << 4 |
                             (ushort)(SUB161(auVar9 >> 0x2f,0) & 1) << 5 |
                             (ushort)(SUB161(auVar9 >> 0x37,0) & 1) << 6 |
                             (ushort)(SUB161(auVar9 >> 0x3f,0) & 1) << 7 |
                             (ushort)(SUB161(auVar9 >> 0x47,0) & 1) << 8 |
                             (ushort)(SUB161(auVar9 >> 0x4f,0) & 1) << 9 |
                             (ushort)(SUB161(auVar9 >> 0x57,0) & 1) << 10 |
                             (ushort)(SUB161(auVar9 >> 0x5f,0) & 1) << 0xb |
                             (ushort)(SUB161(auVar9 >> 0x67,0) & 1) << 0xc |
                             (ushort)(SUB161(auVar9 >> 0x6f,0) & 1) << 0xd |
                             (ushort)(SUB161(auVar9 >> 0x77,0) & 1) << 0xe |
                            (ushort)(auVar9[0xf] >> 7) << 0xf) != 0xffff) break;
              }
              else {
                if ((uVar7 != 0) || (bVar5 = 0, disp->unixdomain != false)) goto LAB_0015cce9;
                iVar6 = sk_addrtype(disp->addr);
                bVar5 = 0;
                if (iVar6 != 1) goto LAB_0015cce9;
                sk_addrcopy(disp->addr,buf);
                if ((local_98 != 4) || (*local_a0 != buf)) break;
              }
            }
            disp->localauthproto = (int)lVar8;
            safefree(disp->localauthdata);
            __dest = (uchar *)safemalloc(pVar11.len,1,0);
            disp->localauthdata = __dest;
            memcpy(__dest,pVar11.ptr,pVar11.len);
            disp->localauthdatalen = (int)pVar11.len;
            bVar5 = bVar4;
            goto LAB_0015cce9;
          }
          lVar8 = lVar8 + 1;
        }
        bVar5 = 0;
      }
      goto LAB_0015cce9;
    }
LAB_0015cfb6:
    fclose(__stream);
    smemclr(__ptr,0x8000c);
    safefree(__ptr);
    safefree(str);
  }
  return;
}

Assistant:

void x11_get_auth_from_authfile(struct X11Display *disp,
                                const char *authfilename)
{
    FILE *authfp;
    char *buf;
    int size;
    BinarySource src[1];
    int family, protocol;
    ptrlen addr, protoname, data;
    char *displaynum_string;
    int displaynum;
    bool ideal_match = false;
    char *ourhostname;

    /* A maximally sized (wildly implausible) .Xauthority record
     * consists of a 16-bit integer to start with, then four strings,
     * each of which has a 16-bit length field followed by that many
     * bytes of data (i.e. up to 0xFFFF bytes). */
    const size_t MAX_RECORD_SIZE = 2 + 4 * (2+0xFFFF);

    /* We'll want a buffer of twice that size (see below). */
    const size_t BUF_SIZE = 2 * MAX_RECORD_SIZE;

    /*
     * Normally we should look for precisely the details specified in
     * `disp'. However, there's an oddity when the display is local:
     * displays like "localhost:0" usually have their details stored
     * in a Unix-domain-socket record (even if there isn't actually a
     * real Unix-domain socket available, as with OpenSSH's proxy X11
     * server).
     *
     * This is apparently a fudge to get round the meaninglessness of
     * "localhost" in a shared-home-directory context -- xauth entries
     * for Unix-domain sockets already disambiguate this by storing
     * the *local* hostname in the conveniently-blank hostname field,
     * but IP "localhost" records couldn't do this. So, typically, an
     * IP "localhost" entry in the auth database isn't present and if
     * it were it would be ignored.
     *
     * However, we don't entirely trust that (say) Windows X servers
     * won't rely on a straight "localhost" entry, bad idea though
     * that is; so if we can't find a Unix-domain-socket entry we'll
     * fall back to an IP-based entry if we can find one.
     */
    bool localhost = !disp->unixdomain && sk_address_is_local(disp->addr);

    authfp = fopen(authfilename, "rb");
    if (!authfp)
        return;

    ourhostname = get_hostname();

    /*
     * Allocate enough space to hold two maximally sized records, so
     * that a full record can start anywhere in the first half. That
     * way we avoid the accidentally-quadratic algorithm that would
     * arise if we moved everything to the front of the buffer after
     * consuming each record; instead, we only move everything to the
     * front after our current position gets past the half-way mark.
     * Before then, there's no need to move anyway; so this guarantees
     * linear time, in that every byte written into this buffer moves
     * at most once (because every move is from the second half of the
     * buffer to the first half).
     */
    buf = snewn(BUF_SIZE, char);
    size = fread(buf, 1, BUF_SIZE, authfp);
    BinarySource_BARE_INIT(src, buf, size);

    while (!ideal_match) {
        bool match = false;

        if (src->pos >= MAX_RECORD_SIZE) {
            size -= src->pos;
            memcpy(buf, buf + src->pos, size);
            size += fread(buf + size, 1, BUF_SIZE - size, authfp);
            BinarySource_BARE_INIT(src, buf, size);
        }

        family = get_uint16(src);
        addr = get_string_xauth(src);
        displaynum_string = mkstr(get_string_xauth(src));
        displaynum = displaynum_string[0] ? atoi(displaynum_string) : -1;
        sfree(displaynum_string);
        protoname = get_string_xauth(src);
        data = get_string_xauth(src);
        if (get_err(src))
            break;

        /*
         * Now we have a full X authority record in memory. See
         * whether it matches the display we're trying to
         * authenticate to.
         *
         * The details we've just read should be interpreted as
         * follows:
         *
         *  - 'family' is the network address family used to
         *    connect to the display. 0 means IPv4; 6 means IPv6;
         *    256 means Unix-domain sockets.
         *
         *  - 'addr' is the network address itself. For IPv4 and
         *    IPv6, this is a string of binary data of the
         *    appropriate length (respectively 4 and 16 bytes)
         *    representing the address in big-endian format, e.g.
         *    7F 00 00 01 means IPv4 localhost. For Unix-domain
         *    sockets, this is the host name of the machine on
         *    which the Unix-domain display resides (so that an
         *    .Xauthority file on a shared file system can contain
         *    authority entries for Unix-domain displays on
         *    several machines without them clashing).
         *
         *  - 'displaynum' is the display number. An empty display
         *    number is a wildcard for any display number.
         *
         *  - 'protoname' is the authorisation protocol, encoded as
         *    its canonical string name (i.e. "MIT-MAGIC-COOKIE-1",
         *    "XDM-AUTHORIZATION-1" or something we don't recognise).
         *
         *  - 'data' is the actual authorisation data, stored in
         *    binary form.
         */

        if (disp->displaynum < 0 ||
            (displaynum >= 0 && disp->displaynum != displaynum))
            continue;                  /* not the one */

        for (protocol = 1; protocol < lenof(x11_authnames); protocol++)
            if (ptrlen_eq_string(protoname, x11_authnames[protocol]))
                break;
        if (protocol == lenof(x11_authnames))
            continue;  /* don't recognise this protocol, look for another */

        switch (family) {
          case 0:   /* IPv4 */
            if (!disp->unixdomain &&
                sk_addrtype(disp->addr) == ADDRTYPE_IPV4) {
                char buf[4];
                sk_addrcopy(disp->addr, buf);
                if (addr.len == 4 && !memcmp(addr.ptr, buf, 4)) {
                    match = true;
                    /* If this is a "localhost" entry, note it down
                     * but carry on looking for a Unix-domain entry. */
                    ideal_match = !localhost;
                }
            }
            break;
          case 6:   /* IPv6 */
            if (!disp->unixdomain &&
                sk_addrtype(disp->addr) == ADDRTYPE_IPV6) {
                char buf[16];
                sk_addrcopy(disp->addr, buf);
                if (addr.len == 16 && !memcmp(addr.ptr, buf, 16)) {
                    match = true;
                    ideal_match = !localhost;
                }
            }
            break;
          case 256: /* Unix-domain / localhost */
            if ((disp->unixdomain || localhost)
                && ourhostname && ptrlen_eq_string(addr, ourhostname)) {
                /* A matching Unix-domain socket is always the best
                 * match. */
                match = true;
                ideal_match = true;
            }
            break;
        }

        if (match) {
            /* Current best guess -- may be overridden if !ideal_match */
            disp->localauthproto = protocol;
            sfree(disp->localauthdata); /* free previous guess, if any */
            disp->localauthdata = snewn(data.len, unsigned char);
            memcpy(disp->localauthdata, data.ptr, data.len);
            disp->localauthdatalen = data.len;
        }
    }

    fclose(authfp);
    smemclr(buf, 2 * MAX_RECORD_SIZE);
    sfree(buf);
    sfree(ourhostname);
}